

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O1

bool __thiscall
bssl::SSLAEADContext::CiphertextLen
          (SSLAEADContext *this,size_t *out_len,size_t in_len,size_t extra_in_len)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  size_t local_20;
  
  sVar1 = extra_in_len;
  if ((this->cipher_ == (SSL_CIPHER *)0x0) ||
     (iVar2 = EVP_AEAD_CTX_tag_len(&(this->ctx_).ctx_,&local_20,in_len,extra_in_len),
     sVar1 = local_20, iVar2 != 0)) {
    local_20 = sVar1;
    uVar3 = 0;
    if ((this->field_0x26a & 1) != 0) {
      uVar3 = (ulong)this->variable_nonce_len_;
    }
    local_20 = local_20 + in_len + uVar3;
    if (local_20 < in_len || 0xfffe < local_20) {
      bVar4 = false;
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                    ,0x9c);
    }
    else {
      *out_len = local_20;
      bVar4 = true;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool SSLAEADContext::CiphertextLen(size_t *out_len, const size_t in_len,
                                   const size_t extra_in_len) const {
  size_t len;
  if (!SuffixLen(&len, in_len, extra_in_len)) {
    return false;
  }
  len += ExplicitNonceLen();
  len += in_len;
  if (len < in_len || len >= 0xffff) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }
  *out_len = len;
  return true;
}